

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O1

uint P_GetSkyboxPortal(ASkyViewpoint *actor)

{
  FSectorPortal *pFVar1;
  FSectorPortal *pFVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  uint uVar6;
  long lVar7;
  ASkyViewpoint *pAVar8;
  ulong uVar9;
  bool bVar10;
  
  if (actor == (ASkyViewpoint *)0x0) {
    uVar9 = 1;
  }
  else {
    uVar4 = (ulong)sectorPortals.Count;
    bVar10 = uVar4 != 0;
    if (bVar10) {
      lVar7 = 0x38;
      uVar9 = 0;
      do {
        pAVar8 = *(ASkyViewpoint **)((long)&(sectorPortals.Array)->mType + lVar7);
        if ((pAVar8 != (ASkyViewpoint *)0x0) &&
           (((pAVar8->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
          *(undefined8 *)((long)&(sectorPortals.Array)->mType + lVar7) = 0;
          pAVar8 = (ASkyViewpoint *)0x0;
        }
        if (pAVar8 == actor) {
          if (bVar10) goto LAB_00565001;
          break;
        }
        uVar9 = uVar9 + 1;
        bVar10 = uVar9 < uVar4;
        lVar7 = lVar7 + 0x40;
      } while (uVar4 != uVar9);
    }
    TArray<FSectorPortal,_FSectorPortal>::Grow(&sectorPortals,1);
    pFVar1 = sectorPortals.Array;
    uVar9 = (ulong)sectorPortals.Count;
    sectorPortals.Count = sectorPortals.Count + 1;
    pFVar2 = sectorPortals.Array + uVar9;
    pFVar2->mPlaneZ = 0.0;
    *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(&pFVar2->mPlaneZ + 1) =
         (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
    pFVar1[uVar9].mDisplacement.X = 0.0;
    pFVar1[uVar9].mDisplacement.Y = 0.0;
    pFVar1[uVar9].mOrigin = (sector_t *)0x0;
    (&pFVar1[uVar9].mOrigin)[1] = (sector_t *)0x0;
    pFVar1 = pFVar1 + uVar9;
    pFVar1->mType = 0;
    pFVar1->mFlags = 0;
    pFVar1->mPartner = 0;
    pFVar1->mPlane = 0;
    if ((actor->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
      iVar3 = (**(actor->super_AActor).super_DThinker.super_DObject._vptr_DObject)(actor);
      (actor->super_AActor).super_DThinker.super_DObject.Class =
           (PClass *)CONCAT44(extraout_var,iVar3);
    }
    pFVar1 = sectorPortals.Array;
    pPVar5 = (actor->super_AActor).super_DThinker.super_DObject.Class;
    if (pPVar5 == ASkyCamCompat::RegistrationInfo.MyClass) {
      uVar6 = 0;
    }
    else {
      do {
        pPVar5 = pPVar5->ParentClass;
        if (pPVar5 == ASkyCamCompat::RegistrationInfo.MyClass) break;
      } while (pPVar5 != (PClass *)0x0);
      uVar6 = (uint)(pPVar5 == (PClass *)0x0);
    }
    sectorPortals.Array[uVar9].mFlags = uVar6;
    pFVar1[uVar9].mSkybox.field_0.p = &actor->super_AActor;
    sectorPortals.Array[uVar9].mDestination = (actor->super_AActor).Sector;
  }
LAB_00565001:
  return (uint)uVar9;
}

Assistant:

unsigned P_GetSkyboxPortal(ASkyViewpoint *actor)
{
	if (actor == NULL) return 1;	// this means a regular sky.
	for (unsigned i = 0;i<sectorPortals.Size();i++)
	{
		if (sectorPortals[i].mSkybox == actor) return i;
	}
	unsigned i = sectorPortals.Reserve(1);
	memset(&sectorPortals[i], 0, sizeof(sectorPortals[i]));
	sectorPortals[i].mType = PORTS_SKYVIEWPOINT;
	sectorPortals[i].mFlags = actor->GetClass()->IsDescendantOf(RUNTIME_CLASS(ASkyCamCompat)) ? 0 : PORTSF_SKYFLATONLY;
	sectorPortals[i].mSkybox = actor;
	sectorPortals[i].mDestination = actor->Sector;
	return i;
}